

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cc
# Opt level: O2

int reschedule_recurring_test(size_t num_threads)

{
  int __how;
  int __fd;
  _Any_data local_240;
  code *local_230;
  code *local_228;
  shared_ptr<simple_thread_pool::TaskHandle> tt;
  size_t count;
  size_t local_208 [2];
  undefined2 local_1f8;
  ThreadPoolMgr mgr;
  _Any_data *msg;
  
  local_208[1]._0_1_ = true;
  local_208[1]._1_1_ = false;
  local_208[1]._2_6_ = 0;
  local_1f8._0_1_ = (__atomic_base<bool>)0x0;
  local_1f8._1_1_ = 1;
  local_208[0] = num_threads;
  simple_thread_pool::ThreadPoolMgr::ThreadPoolMgr(&mgr);
  simple_thread_pool::ThreadPoolMgr::init(&mgr,(EVP_PKEY_CTX *)local_208);
  TestSuite::_msgt("begin\n");
  local_240._M_unused._M_object = &count;
  count = 0;
  local_240._8_8_ = 0;
  local_228 = std::
              _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:237:22)>
              ::_M_invoke;
  local_230 = std::
              _Function_handler<void_(const_simple_thread_pool::TaskResult_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]simple_thread_pool/tests/basic_test.cc:237:22)>
              ::_M_manager;
  simple_thread_pool::ThreadPoolMgr::addTask
            ((ThreadPoolMgr *)&tt,(TaskHandler *)&mgr,(uint64_t)&local_240,200000);
  std::_Function_base::~_Function_base((_Function_base *)&local_240);
  local_240._8_8_ = 0;
  local_230 = (code *)((ulong)local_230 & 0xffffffffffffff00);
  local_240._M_unused._M_object = &local_230;
  TestSuite::sleep_sec(1,(string *)&local_240);
  std::__cxx11::string::~string((string *)local_240._M_pod_data);
  simple_thread_pool::TaskHandle::reschedule
            (tt.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,100000);
  TestSuite::_msgt("rescheduled 200 ms -> 100 ms\n");
  msg = &local_240;
  local_240._8_8_ = 0;
  local_230 = (code *)((ulong)local_230 & 0xffffffffffffff00);
  local_240._M_unused._M_object = &local_230;
  TestSuite::sleep_sec(1,(string *)msg);
  __fd = (int)msg;
  std::__cxx11::string::~string((string *)local_240._M_pod_data);
  simple_thread_pool::ThreadPoolMgr::shutdown(&mgr,__fd,__how);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tt.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  simple_thread_pool::ThreadPoolMgr::~ThreadPoolMgr(&mgr);
  return 0;
}

Assistant:

int reschedule_recurring_test(size_t num_threads) {
    ThreadPoolOptions opt;
    opt.numInitialThreads = num_threads;

    // Initialize thread pool.
    ThreadPoolMgr mgr;
    mgr.init(opt);

    TestSuite::_msgt("begin\n");

    // Register a recurring timer whose interval is 200 ms.
    size_t count = 0;
    std::shared_ptr<TaskHandle> tt =
        mgr.addTask( [&count](const TaskResult& ret) {
                         TestSuite::_msgt("[%02zx] hello world %zu\n",
                                          tid_simple(), count++);
                     },
                     200000,
                     TaskType::RECURRING );
    // Wait 1 second, timer should be fired 5 times.
    TestSuite::sleep_sec(1);

    // Re-schedule the timer, now interval is 100 ms.
    tt->reschedule(100000);
    TestSuite::_msgt("rescheduled 200 ms -> 100 ms\n");

    // Wait another 1 second, timer should be fired 10 times.
    TestSuite::sleep_sec(1);

    // Shutdown thread pool.
    mgr.shutdown();
    return 0;
}